

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall
google::protobuf::UninterpretedOption::InternalSwap
          (UninterpretedOption *this,UninterpretedOption *other)

{
  InternalMetadataWithArena *this_00;
  double dVar1;
  uint32 uVar2;
  int iVar3;
  void *pvVar4;
  Rep *pRVar5;
  string *psVar6;
  uint64 uVar7;
  int64 iVar8;
  UnknownFieldSet *other_00;
  
  this_00 = &other->_internal_metadata_;
  if ((((ulong)(this->_internal_metadata_).
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               .ptr_ & 1) != 0) ||
     (((ulong)(this_00->
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              ).ptr_ & 1) != 0)) {
    pvVar4 = (this_00->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_;
    if (((ulong)pvVar4 & 1) == 0) {
      other_00 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                 ::mutable_unknown_fields_slow
                           (&this_00->
                             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                           );
    }
    else {
      other_00 = (UnknownFieldSet *)((ulong)pvVar4 & 0xfffffffffffffffe);
    }
    internal::InternalMetadataWithArena::DoSwap(&this->_internal_metadata_,other_00);
  }
  uVar2 = (this->_has_bits_).has_bits_[0];
  (this->_has_bits_).has_bits_[0] = (other->_has_bits_).has_bits_[0];
  (other->_has_bits_).has_bits_[0] = uVar2;
  pRVar5 = (this->name_).super_RepeatedPtrFieldBase.rep_;
  (this->name_).super_RepeatedPtrFieldBase.rep_ = (other->name_).super_RepeatedPtrFieldBase.rep_;
  (other->name_).super_RepeatedPtrFieldBase.rep_ = pRVar5;
  iVar3 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  (this->name_).super_RepeatedPtrFieldBase.current_size_ =
       (other->name_).super_RepeatedPtrFieldBase.current_size_;
  (other->name_).super_RepeatedPtrFieldBase.current_size_ = iVar3;
  iVar3 = (this->name_).super_RepeatedPtrFieldBase.total_size_;
  (this->name_).super_RepeatedPtrFieldBase.total_size_ =
       (other->name_).super_RepeatedPtrFieldBase.total_size_;
  (other->name_).super_RepeatedPtrFieldBase.total_size_ = iVar3;
  psVar6 = (this->identifier_value_).ptr_;
  (this->identifier_value_).ptr_ = (other->identifier_value_).ptr_;
  (other->identifier_value_).ptr_ = psVar6;
  psVar6 = (this->string_value_).ptr_;
  (this->string_value_).ptr_ = (other->string_value_).ptr_;
  (other->string_value_).ptr_ = psVar6;
  psVar6 = (this->aggregate_value_).ptr_;
  (this->aggregate_value_).ptr_ = (other->aggregate_value_).ptr_;
  (other->aggregate_value_).ptr_ = psVar6;
  uVar7 = this->positive_int_value_;
  this->positive_int_value_ = other->positive_int_value_;
  other->positive_int_value_ = uVar7;
  iVar8 = this->negative_int_value_;
  this->negative_int_value_ = other->negative_int_value_;
  other->negative_int_value_ = iVar8;
  dVar1 = this->double_value_;
  this->double_value_ = other->double_value_;
  other->double_value_ = dVar1;
  return;
}

Assistant:

void UninterpretedOption::InternalSwap(UninterpretedOption* other) {
  using std::swap;
  _internal_metadata_.Swap(&other->_internal_metadata_);
  swap(_has_bits_[0], other->_has_bits_[0]);
  name_.InternalSwap(&other->name_);
  identifier_value_.Swap(&other->identifier_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  string_value_.Swap(&other->string_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  aggregate_value_.Swap(&other->aggregate_value_, &::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(),
    GetArenaNoVirtual());
  swap(positive_int_value_, other->positive_int_value_);
  swap(negative_int_value_, other->negative_int_value_);
  swap(double_value_, other->double_value_);
}